

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_cover<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  float fVar2;
  example *peVar3;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  float *__args;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_84;
  action_score local_68;
  action_score *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  GEN_CS::gen_cs_example_ips(examples,&data->cs_labels);
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar3 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = (long)(peVar3->pred).scalars._end - (long)(peVar3->pred).scalars._begin >> 3;
  uVar13 = data->cover_size;
  uVar14 = uVar11 & 0xffffffff;
  local_58 = ZEXT416((uint)(float)uVar14);
  lVar7 = data->counter * uVar14;
  auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar16._0_8_ = lVar7;
  auVar16._12_4_ = 0x45300000;
  dVar15 = SQRT((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  uVar9 = (uint)uVar11;
  if (uVar9 != 0) {
    uVar12 = 0;
    do {
      local_68.score = 0.0;
      local_68.action = uVar12;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_68);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  uStack_84 = (undefined4)((ulong)dVar15 >> 0x20);
  _local_98 = ZEXT816(0x3f8000003f800000);
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  auVar6._4_4_ = local_58._0_4_;
  auVar6._0_4_ = (float)dVar15;
  auVar6._8_4_ = uStack_84;
  auVar6._12_4_ = local_58._4_4_;
  auVar16 = divps(_local_98,auVar6);
  if (uVar9 != 0) {
    lVar7 = 0;
    do {
      __args = (float *)((long)(peVar3->pred).scalars._begin + lVar7 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&data->scores,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar7 = lVar7 + 8;
    } while (uVar14 * 8 - lVar7 != 0);
  }
  local_98._4_4_ = auVar16._4_4_;
  fVar18 = 1.0 / (float)uVar13;
  if (data->first_only == false) {
    paVar5 = (peVar3->pred).a_s._begin;
    lVar7 = (long)(peVar3->pred).scalars._end - (long)paVar5;
    if (lVar7 != 0) {
      uVar8 = lVar7 >> 3;
      uVar11 = 1;
      uVar13 = uVar11;
      if (1 < uVar8) {
        do {
          uVar13 = uVar11;
          if ((paVar5[uVar11].score != paVar5->score) ||
             (NAN(paVar5[uVar11].score) || NAN(paVar5->score))) break;
          uVar11 = uVar11 + 1;
          uVar13 = uVar8;
        } while (uVar8 != uVar11);
      }
      uVar11 = 0;
      do {
        fVar2 = (peVar3->pred).scalars._begin[uVar11 * 2];
        paVar5 = (data->action_probs)._begin;
        paVar5[(uint)fVar2].score = paVar5[(uint)fVar2].score + fVar18 / (float)uVar13;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  else {
    uVar12 = ((peVar3->pred).a_s._begin)->action;
    paVar5 = (data->action_probs)._begin;
    paVar5[uVar12].score = paVar5[uVar12].score + fVar18;
  }
  local_98._0_4_ = auVar16._0_4_;
  uStack_90 = auVar16._8_4_;
  uStack_8c = auVar16._12_4_;
  if ((float)local_98._4_4_ <= (float)local_98._0_4_) {
    local_98._0_4_ = local_98._4_4_;
  }
  if (1 < data->cover_size) {
    uVar13 = 1;
    do {
      uVar13 = uVar13 + 1;
      GEN_CS::call_cs_ldf<false>
                (data->cs_ldf_learner,examples,&data->cb_labels,&data->cs_labels,
                 &data->prepped_cs_labels,data->offset,uVar13);
      if (uVar9 != 0) {
        uVar11 = 0;
        do {
          pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4[uVar11] = (peVar3->pred).a_s._begin[uVar11].score + pfVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      if (data->first_only == false) {
        paVar5 = (peVar3->pred).a_s._begin;
        lVar7 = (long)(peVar3->pred).scalars._end - (long)paVar5;
        if (lVar7 != 0) {
          uVar10 = lVar7 >> 3;
          uVar8 = 1;
          uVar11 = uVar8;
          if (1 < uVar10) {
            do {
              uVar11 = uVar8;
              if ((paVar5[uVar8].score != paVar5->score) ||
                 (NAN(paVar5[uVar8].score) || NAN(paVar5->score))) break;
              uVar8 = uVar8 + 1;
              uVar11 = uVar10;
            } while (uVar10 != uVar8);
          }
          uVar8 = 0;
          do {
            fVar2 = (peVar3->pred).scalars._begin[uVar8 * 2];
            paVar5 = (data->action_probs)._begin;
            paVar5[(uint)fVar2].score = paVar5[(uint)fVar2].score + fVar18 / (float)uVar11;
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
        }
      }
      else {
        uVar12 = ((peVar3->pred).a_s._begin)->action;
        paVar5 = (data->action_probs)._begin;
        paVar5[uVar12].score = paVar5[uVar12].score + fVar18;
      }
    } while (uVar13 < data->cover_size);
  }
  auVar17._4_12_ = local_98._4_12_;
  auVar17._0_4_ = (float)local_98._0_4_ * (float)local_58._0_4_;
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (auVar17._0_8_,data->nounif ^ 1);
  do_sort(data);
  if (uVar14 != 0) {
    uVar13 = 0;
    do {
      *(action_score *)((peVar3->pred).scalars._begin + uVar13 * 2) =
           (data->action_probs)._begin[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}